

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O1

void anon_unknown.dwarf_9b08f::write_function
               (void *context,Pointer location,Pointer remapped_location,uint32_t value,
               int num_bytes,MemoryAccessType reason)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  Event *this;
  
  this = snestistics::BlockVector<(anonymous_namespace)::Event,_174762>::last
                   ((BlockVector<(anonymous_namespace)::Event,_174762> *)context);
  if ((reason == RANDOM) || (reason == STACK_RELATIVE)) {
    if (this->data_pointer == 0xffffffff) {
      this->data_pointer = remapped_location;
      Event::set_data_size(this,num_bytes);
    }
    else {
      if (this->data_pointer != remapped_location) {
        __assert_fail("event.data_pointer == remapped_location",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fa,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
      uVar2 = this->_pc_bitset;
      uVar3 = 1;
      if (((uVar2 >> 0x1c & 1) == 0) && (uVar3 = 2, (uVar2 >> 0x1d & 1) == 0)) {
        uVar3 = 3;
        if ((uVar2 >> 0x1e & 1) == 0) {
          uVar3 = uVar2 >> 0x1d;
        }
      }
      if (uVar3 != num_bytes) {
        __assert_fail("event.data_size() == num_bytes",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fb,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
    }
    pbVar1 = (byte *)((long)&this->_pc_bitset + 3);
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

void write_function(void* context, Pointer location, Pointer remapped_location, uint32_t value, int num_bytes, MemoryAccessType reason) {
	if (reason != MemoryAccessType::RANDOM && reason != MemoryAccessType::FETCH_INDIRECT)
		return;
	CallbackContext &m = *(CallbackContext*)context;
	snestistics::Trace::MemoryAccess a;
	for (int k = 0; k < num_bytes; ++k) {
		a.adress = remapped_location + k;
		a.pc = m.current_pc | 0x80000000; // Indicates write
		m.accesses.insert(a);
	}
}